

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

void __thiscall
ws::Record::add_helper<std::__cxx11::string&,char_const(&)[9],int&>
          (Record *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f,
          char (*args) [9],int *args_1)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&this->message,(f->_M_dataplus)._M_p,f->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&this->message,*args);
  add<int&>(this,args_1);
  return;
}

Assistant:

void add_helper(T &&f, Args &&...args)
    {
      add(std::forward<T>(f));
      add_helper(std::forward<Args>(args)...);
    }